

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O2

int Bac_ManClpObjNum_rec(Bac_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  Bac_Ntk_t *p_00;
  int iVar3;
  int i;
  
  iVar3 = p->Count;
  if (iVar3 < 0) {
    iVar3 = 0;
    for (i = 0; i < (p->vType).nSize; i = i + 1) {
      iVar1 = Bac_ObjIsBox(p,i);
      if (iVar1 != 0) {
        iVar1 = Bac_ObjIsBoxUser(p,i);
        if (iVar1 == 0) {
          iVar1 = Bac_BoxBiNum(p,i);
          iVar2 = Bac_BoxBoNum(p,i);
          iVar1 = iVar2 + iVar1 + 1;
        }
        else {
          p_00 = Bac_BoxNtk(p,i);
          iVar1 = Bac_ManClpObjNum_rec(p_00);
          iVar2 = Bac_BoxBoNum(p,i);
          iVar1 = iVar2 * 3 + iVar1;
        }
        iVar3 = iVar3 + iVar1;
      }
    }
    p->Count = iVar3;
  }
  return iVar3;
}

Assistant:

int Bac_ManClpObjNum_rec( Bac_Ntk_t * p )
{
    int i, Counter = 0;
    if ( p->Count >= 0 )
        return p->Count;
    Bac_NtkForEachBox( p, i )
        Counter += Bac_ObjIsBoxUser(p, i) ? Bac_ManClpObjNum_rec( Bac_BoxNtk(p, i) ) + 3*Bac_BoxBoNum(p, i) : Bac_BoxSize(p, i);
    return (p->Count = Counter);
}